

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::prepare
          (RenderVertexStorageImage *this,PrepareRenderPassContext *context)

{
  Move<vk::Handle<(vk::HandleType)22>_> *this_00;
  VkRenderPass renderPass;
  Context *pCVar1;
  DeviceInterface *deviceInterface;
  VkDevice device;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  ProgramBinary *pPVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *this_01;
  VkDescriptorImageInfo imageInfo;
  undefined8 uStack_150;
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorPoolSize poolSizes;
  deUint64 dStack_110;
  undefined8 local_108;
  VkAllocationCallbacks *pVStack_100;
  VkDescriptorSetLayoutBinding binding;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayout layout;
  
  renderPass.m_internal = (context->m_renderPass).m_internal;
  pCVar1 = context->m_context->m_context;
  deviceInterface = pCVar1->m_vkd;
  device = pCVar1->m_device;
  pPVar2 = pCVar1->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocateInfo,"storage-image.vert",(allocator<char> *)&imageInfo);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,pPVar3,0);
  local_78.m_data.deleter.m_device = (VkDevice)binding.pImmutableSamplers;
  local_78.m_data.object.m_internal._0_4_ = binding.binding;
  local_78.m_data.object.m_internal._4_4_ = binding.descriptorType;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&binding);
  std::__cxx11::string::~string((string *)&allocateInfo);
  pPVar2 = context->m_context->m_context->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocateInfo,"render-white.frag",(allocator<char> *)&imageInfo);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,pPVar3,0);
  local_98.m_data.deleter.m_device = (VkDevice)binding.pImmutableSamplers;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_98.m_data.object.m_internal._0_4_ = binding.binding;
  local_98.m_data.object.m_internal._4_4_ = binding.descriptorType;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&binding);
  std::__cxx11::string::~string((string *)&allocateInfo);
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  binding.descriptorCount = 1;
  binding.stageFlags = 1;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back(&bindings,&binding);
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.descriptorPool.m_internal = 0;
  createPipelineWithResources
            (deviceInterface,device,renderPass,(deUint32)&local_78,(VkShaderModule *)&local_98,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)&binding,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&allocateInfo,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&bindings,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)&this->m_resources,
             (PipelineResources *)imageInfo.sampler.m_internal);
  std::
  _Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                   *)&allocateInfo);
  std::
  _Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                   *)&binding);
  poolSizes.type = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  poolSizes.descriptorCount = 1;
  binding.binding = 0x21;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x100000001;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&imageInfo,deviceInterface,device,
             (VkDescriptorPoolCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  allocateInfo.descriptorPool.m_internal = imageInfo._16_8_;
  allocateInfo._24_8_ = uStack_150;
  allocateInfo._0_8_ = imageInfo.sampler.m_internal;
  allocateInfo.pNext = (void *)imageInfo.imageView.m_internal;
  imageInfo.sampler.m_internal = 0;
  imageInfo.imageView.m_internal = 0;
  imageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)allocateInfo.descriptorPool.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)allocateInfo._24_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       allocateInfo._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)allocateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&imageInfo);
  layout.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  allocateInfo.pSetLayouts = &layout;
  allocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.descriptorPool.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  allocateInfo.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&imageInfo,deviceInterface,device,
             &allocateInfo);
  binding.pImmutableSamplers = (VkSampler *)imageInfo._16_8_;
  binding.binding = (undefined4)imageInfo.sampler.m_internal;
  binding.descriptorType = imageInfo.sampler.m_internal._4_4_;
  binding.descriptorCount = (undefined4)imageInfo.imageView.m_internal;
  binding.stageFlags = imageInfo.imageView.m_internal._4_4_;
  imageInfo.sampler.m_internal = 0;
  imageInfo.imageView.m_internal = 0;
  imageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageInfo._20_4_ = 0;
  this_00 = &this->m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)binding.pImmutableSamplers;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal = binding._0_8_
  ;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)binding._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&imageInfo);
  binding.binding = 0xf;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)((ulong)binding.pImmutableSamplers & 0xffffffff00000000)
  ;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&poolSizes,deviceInterface,device,
             (VkImageViewCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  imageInfo._16_8_ = local_108;
  imageInfo.sampler.m_internal._0_4_ = poolSizes.type;
  imageInfo.sampler.m_internal._4_4_ = poolSizes.descriptorCount;
  imageInfo.imageView.m_internal = dStack_110;
  poolSizes.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes.descriptorCount = 0;
  this_01 = &this->m_imageView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)imageInfo._16_8_;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       pVStack_100;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       imageInfo.sampler.m_internal;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageInfo.imageView.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&poolSizes);
  imageInfo.sampler.m_internal = 0;
  imageInfo.imageView.m_internal =
       (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  binding.binding = 0x23;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  imageInfo.imageLayout = context->m_context->m_currentImageLayout;
  binding.pImmutableSamplers =
       (VkSampler *)
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,&binding,0,0);
  std::
  _Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ::~_Vector_base(&bindings.
                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                 );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  return;
}

Assistant:

void RenderVertexStorageImage::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-image.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			1u,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkImageViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getImage(),
				vk::VK_IMAGE_VIEW_TYPE_2D,
				vk::VK_FORMAT_R8G8B8A8_UNORM,
				vk::makeComponentMappingRGBA(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0u,
					1u,
					0u,
					1u
				}
			};

			m_imageView = vk::createImageView(vkd, device, &createInfo);
		}

		{
			const vk::VkDescriptorImageInfo			imageInfo	=
			{
				0,
				*m_imageView,
				context.getImageLayout()
			};
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				*m_descriptorSet,
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
				&imageInfo,
				DE_NULL,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}